

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles3::Functional::TextureUnitCase::iterate(TextureUnitCase *this)

{
  ChannelOrder CVar1;
  ChannelOrder CVar2;
  int iVar3;
  uint uVar4;
  RenderContext *context;
  TestLog *log;
  Texture3D *pTVar5;
  Texture2DArray *pTVar6;
  Texture2D *pTVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  undefined4 extraout_var;
  char *description;
  ChannelOrder height;
  long lVar13;
  ChannelOrder width;
  Surface refFrame;
  Surface gles3Frame;
  ReferenceContextBuffers buffers;
  Random rnd;
  vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> texSizes;
  Surface local_6398;
  Surface local_6380;
  ReferenceContextBuffers local_6368;
  PixelBufferAccess local_62f0;
  ReferenceContextLimits local_62c8;
  deRandom local_6270;
  MultisamplePixelBufferAccess local_6260;
  MultisamplePixelBufferAccess local_6238;
  MultisamplePixelBufferAccess local_6210;
  undefined1 local_61e8 [12];
  int iStack_61dc;
  pointer local_61d8;
  ChannelOrder *pCVar12;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar9 = (*context->_vptr_RenderContext[4])();
  pCVar12 = (ChannelOrder *)CONCAT44(extraout_var,iVar9);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deRandom_init(&local_6270,this->m_randSeed);
  CVar1 = *pCVar12;
  width = 0x80;
  if ((int)CVar1 < 0x80) {
    width = CVar1;
  }
  height = 0x80;
  if ((int)pCVar12[1] < 0x80) {
    height = pCVar12[1];
  }
  dVar10 = deRandom_getUint32(&local_6270);
  CVar2 = pCVar12[1];
  dVar11 = deRandom_getUint32(&local_6270);
  tcu::Surface::Surface(&local_6380,width,height);
  tcu::Surface::Surface(&local_6398,width,height);
  local_61e8._0_8_ = (pointer)0x0;
  stack0xffffffffffff9e20 = (pointer)0x0;
  local_61d8 = (pointer)0x0;
  std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::reserve
            ((vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)local_61e8,
             (long)this->m_numUnits);
  if (0 < this->m_numUnits) {
    lVar13 = 0;
    do {
      iVar9 = (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13];
      iVar3 = (this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar9];
      uVar4 = (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar9];
      if ((int)uVar4 < 0x8513) {
        if (uVar4 == 0xde1) {
          pTVar7 = (this->m_textures2d).
                   super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3];
          local_6368.m_colorbuffer.m_format.order = pTVar7->m_width;
          local_6368.m_colorbuffer.m_format.type = pTVar7->m_height;
          local_6368.m_colorbuffer.m_size.m_data[0] = 0;
          std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
          emplace_back<tcu::Vector<int,3>>
                    ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)local_61e8,
                     (Vector<int,_3> *)&local_6368);
        }
        else if (uVar4 == 0x806f) {
          pTVar5 = (this->m_textures3d).
                   super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3];
          local_6368.m_colorbuffer.m_format.order = pTVar5->m_width;
          local_6368.m_colorbuffer.m_format.type = pTVar5->m_height;
          local_6368.m_colorbuffer.m_size.m_data[0] = pTVar5->m_depth;
          std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
          emplace_back<tcu::Vector<int,3>>
                    ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)local_61e8,
                     (Vector<int,_3> *)&local_6368);
        }
      }
      else if (uVar4 == 0x8513) {
        local_6368.m_colorbuffer.m_format.type =
             (this->m_texturesCube).
             super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar3]->m_size;
        local_6368.m_colorbuffer.m_format.order = local_6368.m_colorbuffer.m_format.type;
        local_6368.m_colorbuffer.m_size.m_data[0] = 0;
        std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
        emplace_back<tcu::Vector<int,3>>
                  ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)local_61e8,
                   (Vector<int,_3> *)&local_6368);
      }
      else if (uVar4 == 0x8c1a) {
        pTVar6 = (this->m_textures2dArray).
                 super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar3];
        local_6368.m_colorbuffer.m_format.order = pTVar6->m_width;
        local_6368.m_colorbuffer.m_format.type = pTVar6->m_height;
        local_6368.m_colorbuffer.m_size.m_data[0] = 0;
        std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
        emplace_back<tcu::Vector<int,3>>
                  ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)local_61e8,
                   (Vector<int,_3> *)&local_6368);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->m_numUnits);
  }
  local_6368.m_colorbuffer.m_format.type = height;
  local_6368.m_colorbuffer.m_format.order = width;
  MultiTexShader::makeSafeLods
            (this->m_shader,
             (vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)local_61e8,
             (IVec2 *)&local_6368);
  if ((pointer)local_61e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_61e8._0_8_,(long)local_61d8 - local_61e8._0_8_);
  }
  local_6368.m_colorbuffer.m_format.type = dVar11 % ((CVar2 - height) + 1);
  local_6368.m_colorbuffer.m_format.order = dVar10 % ((CVar1 - width) + 1);
  local_6368.m_colorbuffer.m_size.m_data[0] = width;
  local_6368.m_colorbuffer.m_size.m_data[1] = height;
  sglr::GLContext::GLContext((GLContext *)local_61e8,context,log,3,(IVec4 *)&local_6368);
  render(this,(Context *)local_61e8);
  sglr::Context::readPixels((Context *)local_61e8,&local_6380,0,0,width,height);
  sglr::GLContext::~GLContext((GLContext *)local_61e8);
  local_61e8._0_8_ = (pointer)0x800000008;
  stack0xffffffffffff9e20 = (pointer)CONCAT44((uint)(pCVar12[5] != R) << 3,8);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&local_6368,(PixelFormat *)local_61e8,0,0,width,height,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_62c8,context);
  tcu::TextureLevel::getAccess(&local_62f0,&local_6368.m_colorbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_62f0);
  tcu::TextureLevel::getAccess(&local_62f0,&local_6368.m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_62f0);
  tcu::TextureLevel::getAccess(&local_62f0,&local_6368.m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_62f0);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_61e8,&local_62c8,&local_6210,&local_6238,&local_6260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_62c8.extensionStr._M_dataplus._M_p != &local_62c8.extensionStr.field_2) {
    operator_delete(local_62c8.extensionStr._M_dataplus._M_p,
                    local_62c8.extensionStr.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_62c8.extensionList);
  render(this,(Context *)local_61e8);
  sglr::Context::readPixels((Context *)local_61e8,&local_6398,0,0,width,height);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_61e8);
  tcu::TextureLevel::~TextureLevel(&local_6368.m_stencilbuffer);
  tcu::TextureLevel::~TextureLevel(&local_6368.m_depthbuffer);
  tcu::TextureLevel::~TextureLevel(&local_6368.m_colorbuffer);
  bVar8 = tcu::fuzzyCompare(log,"ComparisonResult","Image comparison result",&local_6398,&local_6380
                            ,0.001,COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar8) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar8,description
            );
  tcu::Surface::~Surface(&local_6398);
  tcu::Surface::~Surface(&local_6380);
  return STOP;
}

Assistant:

TextureUnitCase::IterateResult TextureUnitCase::iterate (void)
{
	glu::RenderContext&			renderCtx			= m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget		= renderCtx.getRenderTarget();
	tcu::TestLog&				log					= m_testCtx.getLog();
	de::Random					rnd					(m_randSeed);

	int							viewportWidth		= deMin32(VIEWPORT_WIDTH, renderTarget.getWidth());
	int							viewportHeight		= deMin32(VIEWPORT_HEIGHT, renderTarget.getHeight());
	int							viewportX			= rnd.getInt(0, renderTarget.getWidth() - viewportWidth);
	int							viewportY			= rnd.getInt(0, renderTarget.getHeight() - viewportHeight);

	tcu::Surface				gles3Frame			(viewportWidth, viewportHeight);
	tcu::Surface				refFrame			(viewportWidth, viewportHeight);

	{
		// First we do some tricks to make the LODs safer wrt. precision issues. See MultiTexShader::makeSafeLods().

		vector<IVec3> texSizes;
		texSizes.reserve(m_numUnits);

		for (int i = 0; i < m_numUnits; i++)
		{
			int		texNdx			= m_unitTextures[i];
			int		texNdxInType	= m_ndxTexType[texNdx];
			GLenum	type			= m_textureTypes[texNdx];

			switch (type)
			{
				case GL_TEXTURE_2D:			texSizes.push_back(IVec3(m_textures2d[texNdxInType]->getWidth(),		m_textures2d[texNdxInType]->getHeight(),		0));										break;
				case GL_TEXTURE_CUBE_MAP:	texSizes.push_back(IVec3(m_texturesCube[texNdxInType]->getSize(),		m_texturesCube[texNdxInType]->getSize(),		0));										break;
				case GL_TEXTURE_2D_ARRAY:	texSizes.push_back(IVec3(m_textures2dArray[texNdxInType]->getWidth(),	m_textures2dArray[texNdxInType]->getHeight(),	0));										break;
				case GL_TEXTURE_3D:			texSizes.push_back(IVec3(m_textures3d[texNdxInType]->getWidth(),		m_textures3d[texNdxInType]->getHeight(),		m_textures3d[texNdxInType]->getDepth()));	break;
				default:
					DE_ASSERT(DE_FALSE);
			}
		}

		m_shader->makeSafeLods(texSizes, IVec2(viewportWidth, viewportHeight));
	}

	// Render using GLES3.
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS|sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(viewportX, viewportY, viewportWidth, viewportHeight));

		render(context);

		context.readPixels(gles3Frame, 0, 0, viewportWidth, viewportHeight);
	}

	// Render reference image.
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), 0 /* depth */, 0 /* stencil */, viewportWidth, viewportHeight);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		render(context);

		context.readPixels(refFrame, 0, 0, viewportWidth, viewportHeight);
	}

	// Compare images.
	const float		threshold	= 0.001f;
	bool			isOk		= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, gles3Frame, threshold, tcu::COMPARE_LOG_RESULT);

	// Store test result.
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}